

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

void Imath_3_2::jacobiSVD<float>
               (Matrix33<float> *A,Matrix33<float> *U,Vec3<float> *S,Matrix33<float> *V,float tol,
               bool forcePositiveDeterminant)

{
  long lVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  int i;
  long lVar6;
  int iVar7;
  float *pfVar8;
  long lVar9;
  float *pfVar10;
  uint uVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float __tmp;
  float fVar19;
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float r_2;
  float r;
  float fVar26;
  float fVar27;
  float p;
  float fVar28;
  float fVar29;
  float fVar30;
  float z;
  float local_f8;
  
  fVar28 = A->x[0][0];
  fVar16 = A->x[0][1];
  fVar18 = A->x[0][2];
  fVar25 = A->x[1][0];
  fVar30 = A->x[1][1];
  fVar27 = A->x[1][2];
  fVar23 = A->x[2][0];
  fVar26 = A->x[2][1];
  fVar17 = A->x[2][2];
  auVar20._0_12_ = ZEXT812(0x3f800000);
  auVar20._12_4_ = 0;
  *(undefined1 (*) [16])U->x = auVar20;
  *(undefined1 (*) [16])(U->x[1] + 1) = auVar20;
  U->x[2][2] = 1.0;
  *(undefined1 (*) [16])V->x = auVar20;
  *(undefined1 (*) [16])(V->x[1] + 1) = auVar20;
  V->x[2][2] = 1.0;
  fVar19 = ABS(fVar16);
  if (fVar19 <= 0.0) {
    fVar19 = 0.0;
  }
  fVar21 = ABS(fVar18);
  if (ABS(fVar18) <= fVar19) {
    fVar21 = fVar19;
  }
  fVar19 = ABS(fVar25);
  if (ABS(fVar25) <= fVar21) {
    fVar19 = fVar21;
  }
  fVar21 = ABS(fVar27);
  if (ABS(fVar27) <= fVar19) {
    fVar21 = fVar19;
  }
  fVar19 = ABS(fVar23);
  if (ABS(fVar23) <= fVar21) {
    fVar19 = fVar21;
  }
  fVar21 = ABS(fVar26);
  if (ABS(fVar26) <= fVar19) {
    fVar21 = fVar19;
  }
  fVar21 = fVar21 * tol;
  if ((fVar21 != 0.0) || (NAN(fVar21))) {
    uVar11 = 0;
    do {
      bVar12 = ABS(fVar30 + fVar28) * tol < ABS(fVar16 - fVar25);
      if (bVar12) {
        fVar24 = (fVar30 + fVar28) / (fVar16 - fVar25);
        fVar19 = fVar24 * fVar24 + 1.0;
        if (fVar19 < 0.0) {
          fVar19 = sqrtf(fVar19);
        }
        else {
          fVar19 = SQRT(fVar19);
        }
        fVar19 = (float)((uint)-(1.0 / fVar19) & -(uint)(fVar24 < 0.0) |
                        ~-(uint)(fVar24 < 0.0) & (uint)(1.0 / fVar19));
        fVar24 = fVar24 * fVar19;
        fVar29 = (fVar25 + fVar16) * fVar19 + (fVar30 - fVar28) * fVar24;
        fVar13 = fVar24 * fVar16 - fVar19 * fVar30;
        fVar13 = fVar13 + fVar13;
      }
      else {
        fVar29 = fVar30 - fVar28;
        fVar13 = fVar25 + fVar16;
        fVar19 = 0.0;
        fVar24 = 1.0;
      }
      fVar15 = 0.0;
      fVar14 = 1.0;
      if (ABS(fVar29) * tol < ABS(fVar13)) {
        fVar29 = fVar29 / fVar13;
        fVar13 = fVar29 * fVar29 + 1.0;
        if (fVar13 < 0.0) {
          fVar13 = sqrtf(fVar13);
        }
        else {
          fVar13 = SQRT(fVar13);
        }
        fVar13 = 1.0 / (ABS(fVar29) + fVar13);
        fVar15 = (float)((uint)-fVar13 & -(uint)(fVar29 < 0.0) |
                        ~-(uint)(fVar29 < 0.0) & (uint)fVar13);
        fVar14 = fVar15 * fVar15 + 1.0;
        if (fVar14 < 0.0) {
          fVar14 = sqrtf(fVar14);
        }
        else {
          fVar14 = SQRT(fVar14);
        }
        fVar14 = 1.0 / fVar14;
        fVar15 = fVar15 * fVar14;
        bVar12 = true;
      }
      if (bVar12) {
        fVar29 = fVar15 * fVar24 + fVar19 * fVar14;
        fVar24 = fVar24 * fVar14 + fVar19 * -fVar15;
        fVar19 = -fVar15 * fVar26;
        fVar13 = -fVar29 * fVar27;
        lVar6 = 0;
        do {
          fVar22 = *(float *)((long)U->x[0] + lVar6);
          fVar2 = *(float *)((long)U->x[0] + lVar6 + 4);
          *(ulong *)((long)U->x[0] + lVar6) =
               CONCAT44(fVar22 * fVar29 + fVar2 * fVar24,fVar22 * fVar24 + -fVar2 * fVar29);
          lVar6 = lVar6 + 0xc;
        } while (lVar6 != 0x24);
        fVar22 = fVar15 * fVar28;
        lVar6 = 0;
        do {
          fVar2 = *(float *)((long)V->x[0] + lVar6);
          fVar3 = *(float *)((long)V->x[0] + lVar6 + 4);
          *(ulong *)((long)V->x[0] + lVar6) =
               CONCAT44(fVar15 * fVar2 + fVar3 * fVar14,fVar14 * fVar2 + -fVar3 * fVar15);
          lVar6 = lVar6 + 0xc;
        } while (lVar6 != 0x24);
        fVar28 = fVar24 * (fVar28 * fVar14 + -fVar16 * fVar15) +
                 -fVar29 * (fVar25 * fVar14 - fVar15 * fVar30);
        fVar30 = fVar29 * (fVar22 + fVar16 * fVar14) + (fVar25 * fVar15 + fVar14 * fVar30) * fVar24;
        fVar26 = fVar26 * fVar14 + fVar15 * fVar23;
        fVar27 = fVar27 * fVar24 + fVar29 * fVar18;
        fVar23 = fVar14 * fVar23 + fVar19;
        fVar18 = fVar24 * fVar18 + fVar13;
      }
      bVar4 = ABS(fVar17 + fVar28) * tol < ABS(fVar18 - fVar23);
      if (bVar4) {
        fVar13 = (fVar17 + fVar28) / (fVar18 - fVar23);
        fVar16 = fVar13 * fVar13 + 1.0;
        if (fVar16 < 0.0) {
          fVar16 = sqrtf(fVar16);
        }
        else {
          fVar16 = SQRT(fVar16);
        }
        fVar19 = (float)((uint)-(1.0 / fVar16) & -(uint)(fVar13 < 0.0) |
                        ~-(uint)(fVar13 < 0.0) & (uint)(1.0 / fVar16));
        fVar13 = fVar13 * fVar19;
        fVar25 = (fVar23 + fVar18) * fVar19 + (fVar17 - fVar28) * fVar13;
        fVar16 = fVar13 * fVar18 - fVar19 * fVar17;
        fVar16 = fVar16 + fVar16;
      }
      else {
        fVar25 = fVar17 - fVar28;
        fVar16 = fVar23 + fVar18;
        fVar19 = 0.0;
        fVar13 = 1.0;
      }
      local_f8 = 0.0;
      fVar24 = 1.0;
      if (ABS(fVar25) * tol < ABS(fVar16)) {
        fVar25 = fVar25 / fVar16;
        fVar16 = fVar25 * fVar25 + 1.0;
        if (fVar16 < 0.0) {
          fVar16 = sqrtf(fVar16);
        }
        else {
          fVar16 = SQRT(fVar16);
        }
        fVar16 = 1.0 / (ABS(fVar25) + fVar16);
        local_f8 = (float)((uint)-fVar16 & -(uint)(fVar25 < 0.0) |
                          ~-(uint)(fVar25 < 0.0) & (uint)fVar16);
        fVar24 = local_f8 * local_f8 + 1.0;
        if (fVar24 < 0.0) {
          fVar24 = sqrtf(fVar24);
        }
        else {
          fVar24 = SQRT(fVar24);
        }
        fVar24 = 1.0 / fVar24;
        local_f8 = local_f8 * fVar24;
        bVar4 = true;
      }
      fVar16 = 0.0;
      fVar25 = 0.0;
      if (bVar4) {
        fVar29 = local_f8 * fVar13 + fVar19 * fVar24;
        fVar19 = fVar13 * fVar24 + -local_f8 * fVar19;
        lVar6 = 8;
        do {
          fVar16 = *(float *)((long)(U->x + -1) + 4 + lVar6);
          fVar25 = *(float *)((long)U->x[0] + lVar6);
          *(float *)((long)(U->x + -1) + 4 + lVar6) = fVar19 * fVar16 - fVar29 * fVar25;
          *(float *)((long)U->x[0] + lVar6) = fVar16 * fVar29 + fVar25 * fVar19;
          lVar6 = lVar6 + 0xc;
        } while (lVar6 != 0x2c);
        fVar13 = fVar28 * local_f8;
        fVar16 = fVar19 * 0.0 + -fVar29 * fVar26;
        fVar25 = fVar24 * 0.0 + -local_f8 * fVar27;
        lVar6 = 8;
        do {
          fVar14 = *(float *)((long)(V->x + -1) + 4 + lVar6);
          fVar15 = *(float *)((long)V->x[0] + lVar6);
          *(float *)((long)(V->x + -1) + 4 + lVar6) = fVar24 * fVar14 - local_f8 * fVar15;
          *(float *)((long)V->x[0] + lVar6) = fVar14 * local_f8 + fVar15 * fVar24;
          lVar6 = lVar6 + 0xc;
        } while (lVar6 != 0x2c);
        fVar28 = fVar19 * (fVar28 * fVar24 + -fVar18 * local_f8) +
                 (fVar23 * fVar24 - local_f8 * fVar17) * -fVar29;
        fVar17 = fVar29 * (fVar13 + fVar18 * fVar24) +
                 (fVar23 * local_f8 + fVar17 * fVar24) * fVar19;
        fVar26 = fVar26 * fVar19 + fVar29 * 0.0;
        fVar27 = fVar27 * fVar24 + local_f8 * 0.0;
      }
      bVar5 = ABS(fVar30 + fVar17) * tol < ABS(fVar27 - fVar26);
      if (bVar5) {
        fVar19 = (fVar30 + fVar17) / (fVar27 - fVar26);
        fVar18 = fVar19 * fVar19 + 1.0;
        if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
        }
        else {
          fVar18 = SQRT(fVar18);
        }
        fVar13 = (float)((uint)-(1.0 / fVar18) & -(uint)(fVar19 < 0.0) |
                        ~-(uint)(fVar19 < 0.0) & (uint)(1.0 / fVar18));
        fVar19 = fVar19 * fVar13;
        fVar23 = (fVar26 + fVar27) * fVar13 + (fVar17 - fVar30) * fVar19;
        fVar18 = fVar19 * fVar27 - fVar13 * fVar17;
        fVar18 = fVar18 + fVar18;
      }
      else {
        fVar23 = fVar17 - fVar30;
        fVar18 = fVar26 + fVar27;
        fVar13 = 0.0;
        fVar19 = 1.0;
      }
      fVar24 = 1.0;
      fVar29 = 0.0;
      if (ABS(fVar23) * tol < ABS(fVar18)) {
        fVar23 = fVar23 / fVar18;
        fVar18 = fVar23 * fVar23 + 1.0;
        if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
        }
        else {
          fVar18 = SQRT(fVar18);
        }
        fVar18 = 1.0 / (ABS(fVar23) + fVar18);
        fVar29 = (float)((uint)-fVar18 & -(uint)(fVar23 < 0.0) |
                        ~-(uint)(fVar23 < 0.0) & (uint)fVar18);
        fVar24 = fVar29 * fVar29 + 1.0;
        if (fVar24 < 0.0) {
          fVar24 = sqrtf(fVar24);
        }
        else {
          fVar24 = SQRT(fVar24);
        }
        fVar24 = 1.0 / fVar24;
        fVar29 = fVar29 * fVar24;
        bVar5 = true;
      }
      fVar23 = 0.0;
      fVar18 = 0.0;
      if (bVar5) {
        fVar14 = fVar19 * fVar24 + -fVar29 * fVar13;
        fVar19 = fVar19 * fVar29 + fVar24 * fVar13;
        lVar6 = 0;
        do {
          fVar18 = *(float *)((long)U->x[0] + lVar6 + 4);
          fVar23 = *(float *)((long)U->x[0] + lVar6 + 8);
          *(ulong *)((long)U->x[0] + lVar6 + 4) =
               CONCAT44(fVar18 * fVar19 + fVar14 * fVar23,fVar18 * fVar14 + fVar19 * -fVar23);
          lVar6 = lVar6 + 0xc;
        } while (lVar6 != 0x24);
        fVar18 = fVar30 * fVar29;
        lVar6 = 0;
        do {
          fVar23 = *(float *)((long)V->x[0] + lVar6 + 4);
          fVar13 = *(float *)((long)V->x[0] + lVar6 + 8);
          *(ulong *)((long)V->x[0] + lVar6 + 4) =
               CONCAT44(fVar23 * fVar29 + fVar13 * fVar24,fVar23 * fVar24 + -fVar13 * fVar29);
          lVar6 = lVar6 + 0xc;
        } while (lVar6 != 0x24);
        fVar30 = (fVar30 * fVar24 + -fVar27 * fVar29) * fVar14 +
                 -fVar19 * (fVar26 * fVar24 + -fVar17 * fVar29);
        fVar17 = (fVar18 + fVar27 * fVar24) * fVar19 + fVar14 * (fVar26 * fVar29 + fVar17 * fVar24);
        fVar23 = fVar25 * fVar19 + fVar14 * 0.0;
        fVar18 = fVar16 * fVar29 + fVar24 * 0.0;
        fVar16 = fVar24 * fVar16 + fVar29 * -0.0;
        fVar25 = fVar14 * fVar25 + fVar19 * -0.0;
      }
      if (!(bool)(bVar12 | bVar4 | bVar5)) break;
      fVar27 = ABS(fVar16);
      if (fVar27 <= 0.0) {
        fVar27 = 0.0;
      }
      fVar26 = ABS(fVar18);
      if (ABS(fVar18) <= fVar27) {
        fVar26 = fVar27;
      }
      fVar27 = ABS(fVar25);
      if (ABS(fVar25) <= fVar26) {
        fVar27 = fVar26;
      }
      fVar26 = ABS(fVar23);
      if (ABS(fVar23) <= fVar27) {
        fVar26 = fVar27;
      }
      if (fVar26 <= fVar21) break;
      fVar26 = 0.0;
      fVar27 = 0.0;
      bVar12 = uVar11 < 0x13;
      uVar11 = uVar11 + 1;
    } while (bVar12);
  }
  S->x = fVar28;
  S->y = fVar30;
  S->z = fVar17;
  lVar6 = 0;
  pfVar8 = (float *)U;
  do {
    if ((&S->x)[lVar6] < 0.0) {
      (&S->x)[lVar6] = -(&S->x)[lVar6];
      lVar9 = 0;
      do {
        *(uint *)((long)pfVar8 + lVar9) = *(uint *)((long)pfVar8 + lVar9) ^ 0x80000000;
        lVar9 = lVar9 + 0xc;
      } while (lVar9 != 0x24);
    }
    lVar6 = lVar6 + 1;
    pfVar8 = pfVar8 + 1;
  } while (lVar6 != 3);
  lVar6 = 2;
  iVar7 = 0;
  do {
    pfVar8 = (float *)V;
    pfVar10 = (float *)U;
    lVar9 = 0;
    do {
      fVar28 = (&S->x)[lVar9];
      lVar1 = lVar9 + 1;
      if (fVar28 < (&S->y)[lVar9]) {
        (&S->x)[lVar9] = (&S->y)[lVar9];
        (&S->y)[lVar9] = fVar28;
        lVar9 = 0;
        do {
          *(ulong *)((long)pfVar10 + lVar9) =
               CONCAT44((int)*(undefined8 *)((long)pfVar10 + lVar9),
                        (int)((ulong)*(undefined8 *)((long)pfVar10 + lVar9) >> 0x20));
          lVar9 = lVar9 + 0xc;
        } while (lVar9 != 0x24);
        lVar9 = 0;
        do {
          *(ulong *)((long)pfVar8 + lVar9) =
               CONCAT44((int)*(undefined8 *)((long)pfVar8 + lVar9),
                        (int)((ulong)*(undefined8 *)((long)pfVar8 + lVar9) >> 0x20));
          lVar9 = lVar9 + 0xc;
        } while (lVar9 != 0x24);
      }
      pfVar10 = pfVar10 + 1;
      pfVar8 = pfVar8 + 1;
      lVar9 = lVar1;
    } while (lVar1 != lVar6);
    lVar6 = lVar6 + -1;
    bVar12 = iVar7 == 0;
    iVar7 = iVar7 + 1;
  } while (bVar12);
  if (forcePositiveDeterminant) {
    fVar28 = U->x[1][0];
    fVar16 = U->x[1][1];
    fVar18 = U->x[2][2];
    fVar25 = U->x[1][2];
    fVar30 = U->x[2][1];
    fVar27 = U->x[2][0];
    if ((fVar28 * fVar30 - fVar27 * fVar16) * U->x[0][2] +
        (fVar16 * fVar18 - fVar30 * fVar25) * U->x[0][0] +
        (fVar25 * fVar27 - fVar18 * fVar28) * U->x[0][1] < 0.0) {
      lVar6 = 8;
      do {
        *(uint *)((long)U->x[0] + lVar6) = *(uint *)((long)U->x[0] + lVar6) ^ 0x80000000;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 != 0x2c);
      S->z = -S->z;
    }
    fVar28 = V->x[1][0];
    fVar16 = V->x[1][1];
    fVar18 = V->x[2][2];
    fVar25 = V->x[1][2];
    fVar30 = V->x[2][1];
    fVar27 = V->x[2][0];
    if ((fVar28 * fVar30 - fVar27 * fVar16) * V->x[0][2] +
        (fVar16 * fVar18 - fVar30 * fVar25) * V->x[0][0] +
        (fVar25 * fVar27 - fVar18 * fVar28) * V->x[0][1] < 0.0) {
      lVar6 = 8;
      do {
        *(uint *)((long)V->x[0] + lVar6) = *(uint *)((long)V->x[0] + lVar6) ^ 0x80000000;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 != 0x2c);
      S->z = -S->z;
    }
  }
  return;
}

Assistant:

void
jacobiSVD (
    const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>&       U,
    IMATH_INTERNAL_NAMESPACE::Vec3<T>&           S,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>&       V,
    const T                                      tol,
    const bool                                   forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}